

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::execute
          (RowSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double dVar9;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double dVar10;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar1 = this->m_i;
  lVar5 = (long)iVar1;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[lVar5];
    pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[lVar5];
    rStatus->data[iVar2] = rStatus->data[lVar5];
  }
  pNVar4 = (this->m_col).super_SVectorBase<double>.m_elem;
  uVar6 = (this->m_col).super_SVectorBase<double>.memused;
  dVar15 = 0.0;
  if (0 < (int)uVar6 && pNVar4 != (Nonzero<double> *)0x0) {
    lVar7 = 0;
    do {
      if (*(int *)((long)&pNVar4->idx + lVar7) == iVar1) {
        dVar15 = *(double *)((long)&pNVar4->val + lVar7);
        break;
      }
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar7);
  }
  lVar7 = (long)this->m_j;
  pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar5] = pdVar3[lVar7] * dVar15;
  dVar13 = this->m_obj;
  if (0 < (int)uVar6) {
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&pNVar4->idx + lVar8);
      if (iVar2 != iVar1) {
        dVar13 = dVar13 - *(double *)((long)&pNVar4->val + lVar8) *
                          (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2];
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar8);
  }
  switch(cStatus->data[lVar7]) {
  case ON_UPPER:
    dVar10 = this->m_oldUp;
    goto LAB_001f765e;
  case ON_LOWER:
    dVar10 = this->m_oldLo;
LAB_001f765e:
    dVar9 = pdVar3[lVar7];
    (*(this->super_PostStep)._vptr_PostStep[6])
              (this,lVar7,CONCAT71((int7)((ulong)pNVar4 >> 8),0.0 < dVar15),0);
    dVar18 = ABS(dVar9);
    dVar14 = ABS(dVar10);
    if (ABS(dVar10) <= dVar18) {
      dVar14 = dVar18;
    }
    if (dVar14 <= 1.0) {
      dVar14 = 1.0;
    }
    if (ABS((dVar10 - dVar9) / dVar14) <= extraout_XMM0_Qa_03) {
      iVar1 = this->m_i;
      rStatus->data[iVar1] = BASIC;
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = this->m_row_obj;
      lVar7 = (long)this->m_j;
    }
    else {
      iVar1 = this->m_j;
      cStatus->data[iVar1] = BASIC;
      dVar14 = this->m_lhs / dVar15;
      dVar10 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar9 = ABS(dVar14);
      dVar18 = ABS(dVar10);
      if (dVar9 <= dVar18) {
        dVar9 = dVar18;
      }
      if (dVar9 <= 1.0) {
        dVar9 = 1.0;
      }
      iVar1 = this->m_i;
      rStatus->data[iVar1] = (uint)(ABS((dVar14 - dVar10) / dVar9) <= extraout_XMM0_Qa_04);
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = dVar13 / dVar15;
      lVar7 = (long)this->m_j;
LAB_001f7754:
      dVar13 = 0.0;
    }
    break;
  case FIXED:
    auVar20._0_8_ = this->m_lhs;
    auVar20._8_8_ = this->m_rhs;
    uVar6 = (uint)(0.0 < dVar15);
    auVar19._0_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar19._4_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar19._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar19._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar12._8_4_ = (int)auVar20._0_8_;
    auVar12._0_8_ = auVar20._8_8_;
    auVar12._12_4_ = (int)((ulong)auVar20._0_8_ >> 0x20);
    auVar11._8_8_ = dVar15;
    auVar11._0_8_ = dVar15;
    auVar20 = divpd(~auVar19 & auVar12 | auVar20 & auVar19,auVar11);
    dVar10 = auVar20._0_8_;
    dVar9 = auVar20._8_8_;
    if ((dVar10 <= this->m_oldLo) && (this->m_oldUp <= dVar9)) {
LAB_001f7a2d:
      rStatus->data[lVar5] = BASIC;
      dVar13 = this->m_row_obj;
      lVar7 = lVar5;
      r = y;
      break;
    }
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar17 = SUB168(auVar20 & _DAT_005f4110,8);
    dVar18 = SUB168(auVar20 & _DAT_005f4110,0);
    dVar14 = dVar18;
    if (dVar18 <= dVar17) {
      dVar14 = dVar17;
    }
    if (dVar14 <= 1.0) {
      dVar14 = 1.0;
    }
    if ((double)((ulong)((dVar10 - dVar9) / dVar14) & (ulong)DAT_005f4110) <= extraout_XMM0_Qa) {
      dVar10 = this->m_oldLo;
      dVar9 = this->m_oldUp;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar14 = ABS(dVar10);
      dVar18 = ABS(dVar9);
      if (dVar14 <= dVar18) {
        dVar14 = dVar18;
      }
      if (dVar14 <= 1.0) {
        dVar14 = 1.0;
      }
      if (ABS((dVar10 - dVar9) / dVar14) <= extraout_XMM0_Qa_05) {
LAB_001f7a29:
        lVar5 = (long)this->m_i;
        goto LAB_001f7a2d;
      }
      dVar10 = this->m_oldLo;
      dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar14 = ABS(dVar10);
      dVar18 = ABS(dVar9);
      if (dVar14 <= dVar18) {
        dVar14 = dVar18;
      }
      if (dVar14 <= 1.0) {
        dVar14 = 1.0;
      }
      if ((extraout_XMM0_Qa_06 < ABS((dVar10 - dVar9) / dVar14)) ||
         (dVar10 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j],
         (*(this->super_PostStep)._vptr_PostStep[6])(this), -extraout_XMM0_Qa_07 < dVar10)) {
        dVar10 = this->m_oldUp;
        dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        dVar14 = ABS(dVar10);
        dVar18 = ABS(dVar9);
        if (dVar14 <= dVar18) {
          dVar14 = dVar18;
        }
        if (dVar14 <= 1.0) {
          dVar14 = 1.0;
        }
        if ((extraout_XMM0_Qa_08 < ABS((dVar10 - dVar9) / dVar14)) ||
           (dVar10 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j],
           (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar10 < extraout_XMM0_Qa_09)) {
          dVar10 = this->m_oldLo;
          dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_j];
          (*(this->super_PostStep)._vptr_PostStep[6])(this);
          dVar14 = ABS(dVar10);
          dVar18 = ABS(dVar9);
          if (dVar14 <= dVar18) {
            dVar14 = dVar18;
          }
          if (dVar14 <= 1.0) {
            dVar14 = 1.0;
          }
          if (extraout_XMM0_Qa_10 < ABS((dVar10 - dVar9) / dVar14)) {
            dVar10 = this->m_oldUp;
            dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[this->m_j];
            (*(this->super_PostStep)._vptr_PostStep[6])(this);
            dVar14 = ABS(dVar10);
            dVar18 = ABS(dVar9);
            if (dVar14 <= dVar18) {
              dVar14 = dVar18;
            }
            if (dVar14 <= 1.0) {
              dVar14 = 1.0;
            }
            if (extraout_XMM0_Qa_11 < ABS((dVar10 - dVar9) / dVar14)) goto LAB_001f79dd;
          }
          dVar15 = this->m_oldLo;
          dVar10 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j];
          (*(this->super_PostStep)._vptr_PostStep[6])(this);
          dVar9 = ABS(dVar15);
          dVar14 = ABS(dVar10);
          if (dVar9 <= dVar14) {
            dVar9 = dVar14;
          }
          if (dVar9 <= 1.0) {
            dVar9 = 1.0;
          }
          lVar7 = (long)this->m_j;
          cStatus->data[lVar7] = (uint)(ABS((dVar15 - dVar10) / dVar9) <= extraout_XMM0_Qa_15);
          goto LAB_001f7bab;
        }
      }
LAB_001f79dd:
      dVar10 = this->m_lhs;
      dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_j] * dVar15;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar14 = ABS(dVar10);
      dVar18 = extraout_XMM0_Qa_12;
    }
    else {
      dVar14 = this->m_oldUp;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar16 = ABS(dVar14);
      if (dVar18 <= dVar16) {
        dVar18 = dVar16;
      }
      if (dVar18 <= 1.0) {
        dVar18 = 1.0;
      }
      if (extraout_XMM0_Qa_00 < ABS((dVar10 - dVar14) / dVar18)) {
        dVar10 = this->m_oldLo;
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        dVar14 = ABS(dVar10);
        if (dVar17 <= dVar14) {
          dVar17 = dVar14;
        }
        if (dVar17 <= 1.0) {
          dVar17 = 1.0;
        }
        if (extraout_XMM0_Qa_01 < ABS((dVar9 - dVar10) / dVar17)) goto LAB_001f7a29;
        dVar10 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (-extraout_XMM0_Qa_02 < dVar10) {
          lVar7 = (long)this->m_j;
          cStatus->data[lVar7] = ON_LOWER;
          goto LAB_001f7bab;
        }
      }
      else {
        dVar10 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (dVar10 < extraout_XMM0_Qa_13) {
          lVar7 = (long)this->m_j;
          cStatus->data[lVar7] = ON_UPPER;
LAB_001f7bab:
          iVar1 = this->m_i;
          rStatus->data[iVar1] = BASIC;
          (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = this->m_row_obj;
          break;
        }
      }
      dVar10 = this->m_lhs / dVar15;
      dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar14 = ABS(dVar10);
      dVar18 = extraout_XMM0_Qa_14;
    }
    if (dVar14 <= ABS(dVar9)) {
      dVar14 = ABS(dVar9);
    }
    if (dVar14 <= 1.0) {
      dVar14 = 1.0;
    }
    iVar1 = this->m_i;
    rStatus->data[iVar1] = (uint)(ABS((dVar10 - dVar9) / dVar14) <= dVar18);
    lVar7 = (long)this->m_j;
    cStatus->data[lVar7] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = dVar13 / dVar15;
    goto LAB_001f7754;
  case ZERO:
    rStatus->data[lVar5] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = this->m_row_obj;
    break;
  case BASIC:
    rStatus->data[lVar5] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = this->m_row_obj;
    dVar13 = 0.0;
    break;
  default:
    goto switchD_001f741d_default;
  }
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar7] = dVar13;
switchD_001f741d_default:
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}